

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O2

void __thiscall FxConstant::FxConstant(FxConstant *this,double val,FScriptPosition *pos)

{
  PFloat *pPVar1;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_Constant,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_00707480;
  pPVar1 = TypeFloat64;
  (this->value).Type = (PType *)TypeFloat64;
  (this->super_FxExpression).ValueType = (PType *)pPVar1;
  (this->value).field_1.Float = val;
  (this->super_FxExpression).isresolved = true;
  return;
}

Assistant:

FxConstant(double val, const FScriptPosition &pos) : FxExpression(EFX_Constant, pos)
	{
		ValueType = value.Type = TypeFloat64;
		value.Float = val;
		isresolved = true;
	}